

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

size_t byte_encode(uint8_t *obuff,size_t osize,uint64_t v,uint64_t max)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (max - 1 != 0) {
    uVar3 = v - 1;
    sVar2 = 0;
    uVar4 = max - 1;
    do {
      obuff[sVar2] = (uint8_t)uVar3;
      sVar2 = sVar2 + 1;
      uVar3 = uVar3 >> 8;
      bVar1 = 0xff < uVar4;
      uVar4 = uVar4 >> 8;
    } while (bVar1);
    return sVar2;
  }
  return 0;
}

Assistant:

size_t byte_encode(uint8_t* obuff, size_t osize, uint64_t v, uint64_t max)
{
    int op = 0;
    max--; /* working here with zero-origin values */
    v--;
    while (max) {
        // myassert(op < osize);
        obuff[op++] = v & 255;
        v >>= 8;
        max >>= 8;
    }
    return op;
}